

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O0

void __thiscall tst_RootIndexProxyModel::bug53Rows(tst_RootIndexProxyModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ModelTest *pMVar4;
  qint32 local_aac;
  qsizetype local_aa8;
  qint32 local_a9c;
  qsizetype local_a98;
  QModelIndex local_a90;
  QModelIndex local_a78;
  QModelIndex local_a60;
  QModelIndex local_a48;
  qint32 local_a2c;
  qsizetype local_a28;
  qint32 local_a1c;
  qsizetype local_a18;
  QModelIndex local_a10;
  QModelIndex local_9f8;
  QModelIndex local_9e0;
  QModelIndex local_9c8;
  undefined1 local_9b0 [8];
  QSignalSpy proxy2rowsAboutToBeMovedSpy;
  QSignalSpy proxy2rowsMovedSpy;
  QSignalSpy proxy1rowsAboutToBeMovedSpy;
  QSignalSpy proxy1rowsMovedSpy;
  QSignalSpy proxy2RowsRemovedSpy;
  QSignalSpy proxy2RowsAboutToBeRemovedSpy;
  QSignalSpy proxy1RowsRemovedSpy;
  QSignalSpy proxy1RowsAboutToBeRemovedSpy;
  QSignalSpy proxy2RowsInsertedSpy;
  QSignalSpy proxy2RowsAboutToBeInsertedSpy;
  QSignalSpy proxy1RowsInsertedSpy;
  QSignalSpy proxy1RowsAboutToBeInsertedSpy;
  undefined1 local_398 [24];
  RootIndexProxyModel local_380 [8];
  RootIndexProxyModel proxyModel2;
  QModelIndex local_368;
  undefined1 local_350 [24];
  RootIndexProxyModel local_338 [8];
  RootIndexProxyModel proxyModel1;
  QLatin1Char local_31b;
  QChar local_31a;
  QVariant local_318;
  QModelIndex local_2f8;
  undefined1 local_2e0 [24];
  undefined1 local_2c8 [29];
  QLatin1Char local_2ab;
  QChar local_2aa;
  QVariant local_2a8;
  QModelIndex local_288;
  undefined1 local_270 [29];
  QLatin1Char local_253;
  QChar local_252;
  QVariant local_250;
  QModelIndex local_230;
  undefined1 local_218 [24];
  undefined1 local_200 [29];
  QLatin1Char local_1e3;
  QChar local_1e2;
  QVariant local_1e0;
  QModelIndex local_1c0;
  undefined1 local_1a8 [24];
  undefined1 local_190 [29];
  QLatin1Char local_173;
  QChar local_172;
  QVariant local_170;
  QModelIndex local_150;
  undefined1 local_138 [24];
  QModelIndex local_120;
  undefined1 local_108 [24];
  QModelIndex local_f0;
  QModelIndex local_d8;
  QModelIndex local_c0;
  undefined1 local_a8 [24];
  QModelIndex local_90;
  QModelIndex local_78;
  QModelIndex local_60;
  undefined4 local_48;
  QModelIndex local_38;
  QStandardItemModel local_20 [8];
  ComplexModel baseModel;
  tst_RootIndexProxyModel *this_local;
  
  QStandardItemModel::QStandardItemModel(local_20,(QObject *)0x0);
  QModelIndex::QModelIndex(&local_38);
  bVar1 = QStandardItemModel::insertColumn(local_20,0,&local_38);
  bVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0x1c9);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    QModelIndex::QModelIndex(&local_60);
    bVar2 = QStandardItemModel::insertRows((int)local_20,0,(QModelIndex *)0x2);
    bVar2 = QTest::qVerify((bool)(bVar2 & 1),"baseModel.insertRows(0, 2)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0x1ca);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      QModelIndex::QModelIndex(&local_90);
      QStandardItemModel::index((int)&local_78,(int)local_20,(QModelIndex *)0x0);
      bVar1 = QStandardItemModel::insertColumn(local_20,0,&local_78);
      bVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0, baseModel.index(0, 0))","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0x1cb);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        QModelIndex::QModelIndex(&local_c0);
        QStandardItemModel::index((int)local_a8,(int)local_20,(QModelIndex *)0x0);
        bVar2 = QStandardItemModel::insertRows((int)local_20,0,(QModelIndex *)0x2);
        bVar2 = QTest::qVerify((bool)(bVar2 & 1),"baseModel.insertRows(0, 2, baseModel.index(0, 0))"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0x1cc);
        if (((bVar2 ^ 0xff) & 1) == 0) {
          QModelIndex::QModelIndex(&local_f0);
          QStandardItemModel::index((int)&local_d8,(int)local_20,(QModelIndex *)0x1);
          bVar1 = QStandardItemModel::insertColumn(local_20,0,&local_d8);
          bVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0, baseModel.index(1, 0))","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                 ,0x1cd);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            QModelIndex::QModelIndex(&local_120);
            QStandardItemModel::index((int)local_108,(int)local_20,(QModelIndex *)0x1);
            bVar2 = QStandardItemModel::insertRows((int)local_20,0,(QModelIndex *)0x1);
            bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                   "baseModel.insertRows(0, 1, baseModel.index(1, 0))","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                   ,0x1ce);
            if (((bVar2 ^ 0xff) & 1) == 0) {
              QModelIndex::QModelIndex(&local_150);
              QStandardItemModel::index((int)local_138,(int)local_20,(QModelIndex *)0x0);
              QLatin1Char::QLatin1Char(&local_173,'A');
              QChar::QChar(&local_172,local_173);
              QVariant::QVariant(&local_170,(QChar *)(ulong)(ushort)local_172.ucs);
              bVar2 = QStandardItemModel::setData
                                ((QModelIndex *)local_20,(QVariant *)local_138,(int)&local_170);
              bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                     "baseModel.setData(baseModel.index(0, 0), QChar(QLatin1Char(\'A\')))"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0x1cf);
              QVariant::~QVariant(&local_170);
              if (((bVar2 ^ 0xff) & 1) == 0) {
                QModelIndex::QModelIndex(&local_1c0);
                QStandardItemModel::index((int)local_1a8,(int)local_20,(QModelIndex *)0x0);
                QStandardItemModel::index((int)local_190,(int)local_20,(QModelIndex *)0x0);
                QLatin1Char::QLatin1Char(&local_1e3,'C');
                QChar::QChar(&local_1e2,local_1e3);
                QVariant::QVariant(&local_1e0,(QChar *)(ulong)(ushort)local_1e2.ucs);
                bVar2 = QStandardItemModel::setData
                                  ((QModelIndex *)local_20,(QVariant *)local_190,(int)&local_1e0);
                bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                       "baseModel.setData(baseModel.index(0, 0, baseModel.index(0, 0)), QChar(QLatin1Char(\'C\')))"
                                       ,"",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                       ,0x1d0);
                QVariant::~QVariant(&local_1e0);
                if (((bVar2 ^ 0xff) & 1) == 0) {
                  QModelIndex::QModelIndex(&local_230);
                  QStandardItemModel::index((int)local_218,(int)local_20,(QModelIndex *)0x0);
                  QStandardItemModel::index((int)local_200,(int)local_20,(QModelIndex *)0x1);
                  QLatin1Char::QLatin1Char(&local_253,'D');
                  QChar::QChar(&local_252,local_253);
                  QVariant::QVariant(&local_250,(QChar *)(ulong)(ushort)local_252.ucs);
                  bVar2 = QStandardItemModel::setData
                                    ((QModelIndex *)local_20,(QVariant *)local_200,(int)&local_250);
                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                         "baseModel.setData(baseModel.index(1, 0, baseModel.index(0, 0)), QChar(QLatin1Char(\'D\')))"
                                         ,"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                         ,0x1d1);
                  QVariant::~QVariant(&local_250);
                  if (((bVar2 ^ 0xff) & 1) == 0) {
                    QModelIndex::QModelIndex(&local_288);
                    QStandardItemModel::index((int)local_270,(int)local_20,(QModelIndex *)0x1);
                    QLatin1Char::QLatin1Char(&local_2ab,'B');
                    QChar::QChar(&local_2aa,local_2ab);
                    QVariant::QVariant(&local_2a8,(QChar *)(ulong)(ushort)local_2aa.ucs);
                    bVar2 = QStandardItemModel::setData
                                      ((QModelIndex *)local_20,(QVariant *)local_270,(int)&local_2a8
                                      );
                    bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                           "baseModel.setData(baseModel.index(1, 0), QChar(QLatin1Char(\'B\')))"
                                           ,"",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                           ,0x1d2);
                    QVariant::~QVariant(&local_2a8);
                    if (((bVar2 ^ 0xff) & 1) == 0) {
                      QModelIndex::QModelIndex(&local_2f8);
                      QStandardItemModel::index((int)local_2e0,(int)local_20,(QModelIndex *)0x1);
                      QStandardItemModel::index((int)local_2c8,(int)local_20,(QModelIndex *)0x0);
                      QLatin1Char::QLatin1Char(&local_31b,'E');
                      QChar::QChar(&local_31a,local_31b);
                      QVariant::QVariant(&local_318,(QChar *)(ulong)(ushort)local_31a.ucs);
                      bVar2 = QStandardItemModel::setData
                                        ((QModelIndex *)local_20,(QVariant *)local_2c8,
                                         (int)&local_318);
                      bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                             "baseModel.setData(baseModel.index(0, 0, baseModel.index(1, 0)), QChar(QLatin1Char(\'E\')))"
                                             ,"",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0x1d3);
                      QVariant::~QVariant(&local_318);
                      if (((bVar2 ^ 0xff) & 1) == 0) {
                        RootIndexProxyModel::RootIndexProxyModel(local_338,(QObject *)0x0);
                        pMVar4 = (ModelTest *)operator_new(0x10);
                        ModelTest::ModelTest
                                  (pMVar4,(QAbstractItemModel *)local_338,(QObject *)local_20);
                        RootIndexProxyModel::setSourceModel((QAbstractItemModel *)local_338);
                        QModelIndex::QModelIndex(&local_368);
                        QStandardItemModel::index((int)local_350,(int)local_20,(QModelIndex *)0x0);
                        RootIndexProxyModel::setRootIndex((QModelIndex *)local_338);
                        RootIndexProxyModel::RootIndexProxyModel(local_380,(QObject *)0x0);
                        pMVar4 = (ModelTest *)operator_new(0x10);
                        ModelTest::ModelTest
                                  (pMVar4,(QAbstractItemModel *)local_380,(QObject *)local_20);
                        RootIndexProxyModel::setSourceModel((QAbstractItemModel *)local_380);
                        QModelIndex::QModelIndex
                                  ((QModelIndex *)&proxy1RowsAboutToBeInsertedSpy.m_waiting);
                        QStandardItemModel::index((int)local_398,(int)local_20,(QModelIndex *)0x1);
                        RootIndexProxyModel::setRootIndex((QModelIndex *)local_380);
                        QSignalSpy::QSignalSpy
                                  ((QSignalSpy *)&proxy1RowsInsertedSpy.m_waiting,
                                   (QObject *)local_338,
                                   "2rowsAboutToBeInserted(QModelIndex, int, int)");
                        bVar1 = QSignalSpy::isValid((QSignalSpy *)&proxy1RowsInsertedSpy.m_waiting);
                        bVar2 = QTest::qVerify(bVar1,"proxy1RowsAboutToBeInsertedSpy.isValid()","",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                               ,0x1dd);
                        if ((bVar2 & 1) == 0) {
                          local_48 = 1;
                        }
                        else {
                          QSignalSpy::QSignalSpy
                                    ((QSignalSpy *)&proxy2RowsAboutToBeInsertedSpy.m_waiting,
                                     (QObject *)local_338,"2rowsInserted(QModelIndex, int, int)");
                          bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                      &proxy2RowsAboutToBeInsertedSpy.m_waiting);
                          bVar2 = QTest::qVerify(bVar1,"proxy1RowsInsertedSpy.isValid()","",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                 ,0x1df);
                          if ((bVar2 & 1) == 0) {
                            local_48 = 1;
                          }
                          else {
                            QSignalSpy::QSignalSpy
                                      ((QSignalSpy *)&proxy2RowsInsertedSpy.m_waiting,
                                       (QObject *)local_380,
                                       "2rowsAboutToBeInserted(QModelIndex, int, int)");
                            bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                        &proxy2RowsInsertedSpy.m_waiting);
                            bVar2 = QTest::qVerify(bVar1,"proxy2RowsAboutToBeInsertedSpy.isValid()",
                                                   "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e1);
                            if ((bVar2 & 1) == 0) {
                              local_48 = 1;
                            }
                            else {
                              QSignalSpy::QSignalSpy
                                        ((QSignalSpy *)&proxy1RowsAboutToBeRemovedSpy.m_waiting,
                                         (QObject *)local_380,"2rowsInserted(QModelIndex, int, int)"
                                        );
                              bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                          &proxy1RowsAboutToBeRemovedSpy.m_waiting);
                              bVar2 = QTest::qVerify(bVar1,"proxy2RowsInsertedSpy.isValid()","",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e3);
                              if ((bVar2 & 1) == 0) {
                                local_48 = 1;
                              }
                              else {
                                QSignalSpy::QSignalSpy
                                          ((QSignalSpy *)&proxy1RowsRemovedSpy.m_waiting,
                                           (QObject *)local_338,
                                           "2rowsAboutToBeRemoved(QModelIndex, int, int)");
                                bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                            &proxy1RowsRemovedSpy.m_waiting);
                                bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1RowsAboutToBeRemovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e5);
                                if ((bVar2 & 1) == 0) {
                                  local_48 = 1;
                                }
                                else {
                                  QSignalSpy::QSignalSpy
                                            ((QSignalSpy *)&proxy2RowsAboutToBeRemovedSpy.m_waiting,
                                             (QObject *)local_338,
                                             "2rowsRemoved(QModelIndex, int, int)");
                                  bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                              &proxy2RowsAboutToBeRemovedSpy.
                                                               m_waiting);
                                  bVar2 = QTest::qVerify(bVar1,"proxy1RowsRemovedSpy.isValid()","",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e7);
                                  if ((bVar2 & 1) == 0) {
                                    local_48 = 1;
                                  }
                                  else {
                                    QSignalSpy::QSignalSpy
                                              ((QSignalSpy *)&proxy2RowsRemovedSpy.m_waiting,
                                               (QObject *)local_380,
                                               "2rowsAboutToBeRemoved(QModelIndex, int, int)");
                                    bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                                &proxy2RowsRemovedSpy.m_waiting);
                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2RowsAboutToBeRemovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e9);
                                    if ((bVar2 & 1) == 0) {
                                      local_48 = 1;
                                    }
                                    else {
                                      QSignalSpy::QSignalSpy
                                                ((QSignalSpy *)&proxy1rowsMovedSpy.m_waiting,
                                                 (QObject *)local_380,
                                                 "2rowsRemoved(QModelIndex, int, int)");
                                      bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                                  &proxy1rowsMovedSpy.m_waiting);
                                      bVar2 = QTest::qVerify(bVar1,"proxy2RowsRemovedSpy.isValid()",
                                                             "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1eb);
                                      if ((bVar2 & 1) == 0) {
                                        local_48 = 1;
                                      }
                                      else {
                                        QSignalSpy::QSignalSpy
                                                  ((QSignalSpy *)
                                                   &proxy1rowsAboutToBeMovedSpy.m_waiting,
                                                   (QObject *)local_338,
                                                                                                      
                                                  "2rowsMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                        bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                                    &proxy1rowsAboutToBeMovedSpy.
                                                                     m_waiting);
                                        bVar2 = QTest::qVerify(bVar1,"proxy1rowsMovedSpy.isValid()",
                                                               "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1ed);
                                        if ((bVar2 & 1) == 0) {
                                          local_48 = 1;
                                        }
                                        else {
                                          QSignalSpy::QSignalSpy
                                                    ((QSignalSpy *)&proxy2rowsMovedSpy.m_waiting,
                                                     (QObject *)local_338,
                                                                                                          
                                                  "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                          bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                                      &proxy2rowsMovedSpy.m_waiting)
                                          ;
                                          bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1rowsAboutToBeMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1ef);
                                          if ((bVar2 & 1) == 0) {
                                            local_48 = 1;
                                          }
                                          else {
                                            QSignalSpy::QSignalSpy
                                                      ((QSignalSpy *)
                                                       &proxy2rowsAboutToBeMovedSpy.m_waiting,
                                                       (QObject *)local_380,
                                                                                                              
                                                  "2rowsMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                            bVar1 = QSignalSpy::isValid((QSignalSpy *)
                                                                        &proxy2rowsAboutToBeMovedSpy
                                                                         .m_waiting);
                                            bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2rowsMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f1);
                                            if ((bVar2 & 1) == 0) {
                                              local_48 = 1;
                                            }
                                            else {
                                              QSignalSpy::QSignalSpy
                                                        ((QSignalSpy *)local_9b0,
                                                         (QObject *)local_380,
                                                                                                                  
                                                  "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                              bVar1 = QSignalSpy::isValid((QSignalSpy *)local_9b0);
                                              bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2rowsAboutToBeMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,499);
                                              if ((bVar2 & 1) == 0) {
                                                local_48 = 1;
                                              }
                                              else {
                                                QModelIndex::QModelIndex(&local_9e0);
                                                QStandardItemModel::index
                                                          ((int)&local_9c8,(int)local_20,
                                                           (QModelIndex *)0x0);
                                                bVar1 = QStandardItemModel::insertRow
                                                                  (local_20,2,&local_9c8);
                                                bVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.insertRow(2, baseModel.index(0, 0))",""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,500);
                                                if (((bVar2 ^ 0xff) & 1) == 0) {
                                                  QModelIndex::QModelIndex(&local_9f8);
                                                  iVar3 = RootIndexProxyModel::rowCount
                                                                    ((QModelIndex *)local_338);
                                                  bVar2 = QTest::qCompare(iVar3,3,
                                                  "proxyModel1.rowCount()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f5);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_a10);
                                                    iVar3 = RootIndexProxyModel::rowCount
                                                                      ((QModelIndex *)local_380);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.rowCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f6);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2RowsAboutToBeInsertedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2RowsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f7);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2RowsInsertedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2RowsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f8);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy1RowsAboutToBeRemovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1RowsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f9);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1RowsRemovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1RowsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fa);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2RowsAboutToBeRemovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2RowsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fb);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2RowsRemovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2RowsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fc);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1rowsAboutToBeMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fd);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1rowsMovedSpy.field_0x8
                                                                      );
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fe);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2rowsAboutToBeMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1ff);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2rowsMovedSpy.field_0x8
                                                                      );
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x200);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    local_a18 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&
                                                  proxy1RowsAboutToBeInsertedSpy.field_0x8);
                                                  local_a1c = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_a18,&local_a1c,
                                                                                                                                          
                                                  "proxy1RowsAboutToBeInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x201);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    local_a28 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&proxy1RowsInsertedSpy
                                                                               .field_0x8);
                                                    local_a2c = 1;
                                                    bVar1 = QTest::qCompare<long_long,int>
                                                                      (&local_a28,&local_a2c,
                                                                                                                                              
                                                  "proxy1RowsInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x202);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxy1RowsAboutToBeInsertedSpy.
                                                                field_0x8);
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxy1RowsInsertedSpy.field_0x8);
                                                    QModelIndex::QModelIndex(&local_a60);
                                                    QStandardItemModel::index
                                                              ((int)&local_a48,(int)local_20,
                                                               (QModelIndex *)0x0);
                                                    bVar1 = QAbstractItemModel::removeRow
                                                                      ((QAbstractItemModel *)
                                                                       local_20,2,&local_a48);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.removeRow(2, baseModel.index(0, 0))",""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x206);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_a78);
                                                    iVar3 = RootIndexProxyModel::rowCount
                                                                      ((QModelIndex *)local_338);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "proxyModel1.rowCount()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x207);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_a90);
                                                    iVar3 = RootIndexProxyModel::rowCount
                                                                      ((QModelIndex *)local_380);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.rowCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x208);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    local_a98 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&
                                                  proxy1RowsAboutToBeRemovedSpy.field_0x8);
                                                  local_a9c = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_a98,&local_a9c,
                                                                                                                                          
                                                  "proxy1RowsAboutToBeRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x209);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    local_aa8 = QList<QList<QVariant>_>::count
                                                                          ((QList<QList<QVariant>_>
                                                                            *)&
                                                  proxy1RowsAboutToBeRemovedSpy.field_0x8);
                                                  local_aac = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_aa8,&local_aac,
                                                                                                                                          
                                                  "proxy1RowsAboutToBeRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20a);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy1RowsAboutToBeInsertedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1RowsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20b);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1RowsInsertedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1RowsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20c);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2RowsAboutToBeInsertedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2RowsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20d);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2RowsInsertedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2RowsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20e);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &
                                                  proxy2RowsAboutToBeRemovedSpy.field_0x8);
                                                  bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2RowsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20f);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2RowsRemovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2RowsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x210);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1rowsAboutToBeMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x211);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy1rowsMovedSpy.field_0x8
                                                                      );
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy1rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x212);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2rowsAboutToBeMovedSpy.
                                                                        field_0x8);
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x213);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    bVar1 = QList<QList<QVariant>_>::isEmpty
                                                                      ((QList<QList<QVariant>_> *)
                                                                       &proxy2rowsMovedSpy.field_0x8
                                                                      );
                                                    bVar2 = QTest::qVerify(bVar1,
                                                  "proxy2rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x214);
                                                  if ((bVar2 & 1) == 0) {
                                                    local_48 = 1;
                                                  }
                                                  else {
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxy1RowsAboutToBeRemovedSpy.
                                                                field_0x8);
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxy1RowsAboutToBeRemovedSpy.
                                                                field_0x8);
                                                    local_48 = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_48 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_48 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_48 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_48 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_48 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_48 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_48 = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_48 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_48 = 1;
                                                  }
                                                }
                                                else {
                                                  local_48 = 1;
                                                }
                                              }
                                              QSignalSpy::~QSignalSpy((QSignalSpy *)local_9b0);
                                            }
                                            QSignalSpy::~QSignalSpy
                                                      ((QSignalSpy *)
                                                       &proxy2rowsAboutToBeMovedSpy.m_waiting);
                                          }
                                          QSignalSpy::~QSignalSpy
                                                    ((QSignalSpy *)&proxy2rowsMovedSpy.m_waiting);
                                        }
                                        QSignalSpy::~QSignalSpy
                                                  ((QSignalSpy *)
                                                   &proxy1rowsAboutToBeMovedSpy.m_waiting);
                                      }
                                      QSignalSpy::~QSignalSpy
                                                ((QSignalSpy *)&proxy1rowsMovedSpy.m_waiting);
                                    }
                                    QSignalSpy::~QSignalSpy
                                              ((QSignalSpy *)&proxy2RowsRemovedSpy.m_waiting);
                                  }
                                  QSignalSpy::~QSignalSpy
                                            ((QSignalSpy *)&proxy2RowsAboutToBeRemovedSpy.m_waiting)
                                  ;
                                }
                                QSignalSpy::~QSignalSpy
                                          ((QSignalSpy *)&proxy1RowsRemovedSpy.m_waiting);
                              }
                              QSignalSpy::~QSignalSpy
                                        ((QSignalSpy *)&proxy1RowsAboutToBeRemovedSpy.m_waiting);
                            }
                            QSignalSpy::~QSignalSpy((QSignalSpy *)&proxy2RowsInsertedSpy.m_waiting);
                          }
                          QSignalSpy::~QSignalSpy
                                    ((QSignalSpy *)&proxy2RowsAboutToBeInsertedSpy.m_waiting);
                        }
                        QSignalSpy::~QSignalSpy((QSignalSpy *)&proxy1RowsInsertedSpy.m_waiting);
                        RootIndexProxyModel::~RootIndexProxyModel(local_380);
                        RootIndexProxyModel::~RootIndexProxyModel(local_338);
                      }
                      else {
                        local_48 = 1;
                      }
                    }
                    else {
                      local_48 = 1;
                    }
                  }
                  else {
                    local_48 = 1;
                  }
                }
                else {
                  local_48 = 1;
                }
              }
              else {
                local_48 = 1;
              }
            }
            else {
              local_48 = 1;
            }
          }
          else {
            local_48 = 1;
          }
        }
        else {
          local_48 = 1;
        }
      }
      else {
        local_48 = 1;
      }
    }
    else {
      local_48 = 1;
    }
  }
  else {
    local_48 = 1;
  }
  QStandardItemModel::~QStandardItemModel(local_20);
  return;
}

Assistant:

void tst_RootIndexProxyModel::bug53Rows()
{
#ifdef COMPLEX_MODEL_SUPPORT
    ComplexModel baseModel;
    QVERIFY(baseModel.insertColumn(0));
    QVERIFY(baseModel.insertRows(0, 2));
    QVERIFY(baseModel.insertColumn(0, baseModel.index(0, 0)));
    QVERIFY(baseModel.insertRows(0, 2, baseModel.index(0, 0)));
    QVERIFY(baseModel.insertColumn(0, baseModel.index(1, 0)));
    QVERIFY(baseModel.insertRows(0, 1, baseModel.index(1, 0)));
    QVERIFY(baseModel.setData(baseModel.index(0, 0), QChar(QLatin1Char('A'))));
    QVERIFY(baseModel.setData(baseModel.index(0, 0, baseModel.index(0, 0)), QChar(QLatin1Char('C'))));
    QVERIFY(baseModel.setData(baseModel.index(1, 0, baseModel.index(0, 0)), QChar(QLatin1Char('D'))));
    QVERIFY(baseModel.setData(baseModel.index(1, 0), QChar(QLatin1Char('B'))));
    QVERIFY(baseModel.setData(baseModel.index(0, 0, baseModel.index(1, 0)), QChar(QLatin1Char('E'))));
    RootIndexProxyModel proxyModel1;
    new ModelTest(&proxyModel1, &baseModel);
    proxyModel1.setSourceModel(&baseModel);
    proxyModel1.setRootIndex(baseModel.index(0, 0));
    RootIndexProxyModel proxyModel2;
    new ModelTest(&proxyModel2, &baseModel);
    proxyModel2.setSourceModel(&baseModel);
    proxyModel2.setRootIndex(baseModel.index(1, 0));
    QSignalSpy proxy1RowsAboutToBeInsertedSpy(&proxyModel1, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxy1RowsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxy1RowsInsertedSpy(&proxyModel1, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxy1RowsInsertedSpy.isValid());
    QSignalSpy proxy2RowsAboutToBeInsertedSpy(&proxyModel2, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxy2RowsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxy2RowsInsertedSpy(&proxyModel2, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxy2RowsInsertedSpy.isValid());
    QSignalSpy proxy1RowsAboutToBeRemovedSpy(&proxyModel1, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxy1RowsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxy1RowsRemovedSpy(&proxyModel1, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(proxy1RowsRemovedSpy.isValid());
    QSignalSpy proxy2RowsAboutToBeRemovedSpy(&proxyModel2, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxy2RowsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxy2RowsRemovedSpy(&proxyModel2, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(proxy2RowsRemovedSpy.isValid());
    QSignalSpy proxy1rowsMovedSpy(&proxyModel1, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy1rowsMovedSpy.isValid());
    QSignalSpy proxy1rowsAboutToBeMovedSpy(&proxyModel1, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy1rowsAboutToBeMovedSpy.isValid());
    QSignalSpy proxy2rowsMovedSpy(&proxyModel2, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy2rowsMovedSpy.isValid());
    QSignalSpy proxy2rowsAboutToBeMovedSpy(&proxyModel2, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy2rowsAboutToBeMovedSpy.isValid());
    QVERIFY(baseModel.insertRow(2, baseModel.index(0, 0)));
    QCOMPARE(proxyModel1.rowCount(), 3);
    QCOMPARE(proxyModel2.rowCount(), 1);
    QVERIFY(proxy2RowsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsInsertedSpy.isEmpty());
    QVERIFY(proxy1RowsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy1RowsRemovedSpy.isEmpty());
    QVERIFY(proxy2RowsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2RowsRemovedSpy.isEmpty());
    QVERIFY(proxy1rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1rowsMovedSpy.isEmpty());
    QVERIFY(proxy2rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2rowsMovedSpy.isEmpty());
    QCOMPARE(proxy1RowsAboutToBeInsertedSpy.count(), 1);
    QCOMPARE(proxy1RowsInsertedSpy.count(), 1);
    proxy1RowsAboutToBeInsertedSpy.clear();
    proxy1RowsInsertedSpy.clear();

    QVERIFY(baseModel.removeRow(2, baseModel.index(0, 0)));
    QCOMPARE(proxyModel1.rowCount(), 2);
    QCOMPARE(proxyModel2.rowCount(), 1);
    QCOMPARE(proxy1RowsAboutToBeRemovedSpy.count(), 1);
    QCOMPARE(proxy1RowsAboutToBeRemovedSpy.count(), 1);
    QVERIFY(proxy1RowsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy1RowsInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2RowsRemovedSpy.isEmpty());
    QVERIFY(proxy1rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1rowsMovedSpy.isEmpty());
    QVERIFY(proxy2rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2rowsMovedSpy.isEmpty());
    proxy1RowsAboutToBeRemovedSpy.clear();
    proxy1RowsAboutToBeRemovedSpy.clear();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}